

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O1

size_t __thiscall docopt::BranchPattern::hash(BranchPattern *this)

{
  pointer psVar1;
  int iVar2;
  size_t sVar3;
  undefined4 extraout_var;
  ulong uVar4;
  const_iterator __begin2;
  pointer psVar5;
  const_iterator __end2;
  
  sVar3 = std::type_info::hash_code((type_info *)(this->super_Pattern)._vptr_Pattern[-1]);
  psVar5 = (this->fChildren).
           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->fChildren).
           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar4 = ((long)psVar1 - (long)psVar5 >> 4) + 0x9e3779b9 + (sVar3 >> 2) + sVar3 * 0x40 ^ sVar3;
  for (; psVar1 != psVar5; psVar5 = psVar5 + 1) {
    iVar2 = (*((psVar5->super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              _vptr_Pattern[5])();
    uVar4 = uVar4 * 0x40 + 0x9e3779b9 + (uVar4 >> 2) + CONCAT44(extraout_var,iVar2) ^ uVar4;
  }
  return uVar4;
}

Assistant:

virtual size_t hash() const override {
			size_t seed = typeid(*this).hash_code();
			hash_combine(seed, fChildren.size());
			for(auto const& child : fChildren) {
				hash_combine(seed, child->hash());
			}
			return seed;
		}